

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double calc_kurtosis<double,unsigned_long,double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,
                 unsigned_long *Xc_ind,unsigned_long *Xc_indptr,MissingAction missing_action)

{
  unsigned_long uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong *puVar11;
  ulong *puVar12;
  ulong *puVar13;
  ulong *puVar14;
  unsigned_long uVar15;
  unsigned_long uVar16;
  undefined1 auVar17 [16];
  double __z;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double local_d0;
  ulong local_80;
  
  uVar16 = Xc_indptr[col_num];
  uVar1 = Xc_indptr[col_num + 1];
  if ((uVar16 != uVar1) && (uVar3 = (end - st) + 1, 1 < uVar3)) {
    puVar12 = ix_arr + st;
    puVar10 = ix_arr + end + 1;
    uVar4 = (long)puVar10 - (long)puVar12 >> 3;
    if (0 < (long)uVar4) {
      do {
        uVar5 = uVar4 >> 1;
        uVar7 = ~uVar5 + uVar4;
        uVar4 = uVar5;
        if ((puVar12 + uVar5 + 1)[-1] < Xc_ind[uVar16]) {
          puVar12 = puVar12 + uVar5 + 1;
          uVar4 = uVar7;
        }
      } while (0 < (long)uVar4);
    }
    puVar11 = Xc_ind + (uVar1 - 1);
    uVar4 = *puVar11;
    if (missing_action == Fail) {
      dVar19 = 0.0;
      if (uVar16 != uVar1 && puVar12 != puVar10) {
        dVar18 = 0.0;
        __z = 0.0;
        local_d0 = 0.0;
        while (uVar5 = *puVar12, uVar5 <= uVar4) {
          puVar13 = Xc_ind + uVar16;
          uVar7 = *puVar13;
          if (uVar7 == uVar5) {
            dVar20 = Xc[uVar16];
            dVar21 = dVar20 * dVar20;
            dVar18 = dVar18 + dVar20;
            __z = fma(dVar20,dVar20,__z);
            local_d0 = fma(dVar21,dVar20,local_d0);
            dVar19 = fma(dVar21,dVar21,dVar19);
            if ((puVar12 == ix_arr + end) || (uVar16 == uVar1 - 1)) break;
            puVar14 = puVar13 + 1;
            puVar12 = puVar12 + 1;
            uVar5 = (long)puVar11 + (8 - (long)puVar14) >> 3;
            if (0 < (long)uVar5) {
              do {
                uVar7 = uVar5 >> 1;
                uVar8 = ~uVar7 + uVar5;
                uVar5 = uVar7;
                if (puVar14[uVar7] < *puVar12) {
                  puVar14 = puVar14 + uVar7 + 1;
                  uVar5 = uVar8;
                }
              } while (0 < (long)uVar5);
            }
LAB_00130ea1:
            uVar16 = (long)puVar14 - (long)Xc_ind >> 3;
          }
          else {
            if (uVar7 <= uVar5) {
              puVar14 = puVar13 + 1;
              uVar7 = (long)puVar11 + (8 - (long)(puVar13 + 1)) >> 3;
              while (0 < (long)uVar7) {
                uVar8 = uVar7 >> 1;
                uVar9 = ~uVar8 + uVar7;
                uVar7 = uVar8;
                if (puVar14[uVar8] < uVar5) {
                  puVar14 = puVar14 + uVar8 + 1;
                  uVar7 = uVar9;
                }
              }
              goto LAB_00130ea1;
            }
            puVar12 = puVar12 + 1;
            uVar5 = (long)puVar10 - (long)puVar12 >> 3;
            while (0 < (long)uVar5) {
              uVar8 = uVar5 >> 1;
              uVar9 = ~uVar8 + uVar5;
              uVar5 = uVar8;
              if ((puVar12 + uVar8 + 1)[-1] < uVar7) {
                puVar12 = puVar12 + uVar8 + 1;
                uVar5 = uVar9;
              }
            }
          }
          if ((puVar12 == puVar10) || (uVar16 == uVar1)) break;
        }
      }
      else {
        local_d0 = 0.0;
        __z = 0.0;
        dVar18 = 0.0;
      }
    }
    else {
      dVar19 = 0.0;
      local_d0 = 0.0;
      __z = 0.0;
      dVar18 = 0.0;
      local_80 = uVar3;
      if (uVar16 != uVar1 && puVar12 != puVar10) {
        local_d0 = 0.0;
        uVar15 = uVar16;
        while (uVar5 = *puVar12, uVar5 <= uVar4) {
          puVar13 = Xc_ind + uVar15;
          uVar7 = *puVar13;
          if (uVar7 == uVar5) {
            dVar20 = Xc[uVar15];
            if ((ulong)ABS(dVar20) < 0x7ff0000000000000) {
              dVar21 = dVar20 * dVar20;
              dVar18 = dVar18 + dVar20;
              __z = fma(dVar20,dVar20,__z);
              local_d0 = fma(dVar21,dVar20,local_d0);
              dVar19 = fma(dVar21,dVar21,dVar19);
            }
            else {
              local_80 = local_80 - 1;
            }
            if ((puVar12 == ix_arr + end) || (uVar15 == uVar1 - 1)) break;
            puVar14 = puVar13 + 1;
            puVar12 = puVar12 + 1;
            uVar5 = (long)puVar11 + (8 - (long)puVar14) >> 3;
            if (0 < (long)uVar5) {
              do {
                uVar7 = uVar5 >> 1;
                uVar8 = ~uVar7 + uVar5;
                uVar5 = uVar7;
                if (puVar14[uVar7] < *puVar12) {
                  puVar14 = puVar14 + uVar7 + 1;
                  uVar5 = uVar8;
                }
              } while (0 < (long)uVar5);
            }
LAB_00130c99:
            uVar15 = (long)puVar14 - (long)Xc_ind >> 3;
          }
          else {
            if (uVar7 <= uVar5) {
              puVar14 = puVar13 + 1;
              uVar7 = (long)puVar11 + (8 - (long)(puVar13 + 1)) >> 3;
              while (0 < (long)uVar7) {
                uVar8 = uVar7 >> 1;
                uVar9 = ~uVar8 + uVar7;
                uVar7 = uVar8;
                if (puVar14[uVar8] < uVar5) {
                  puVar14 = puVar14 + uVar8 + 1;
                  uVar7 = uVar9;
                }
              }
              goto LAB_00130c99;
            }
            puVar12 = puVar12 + 1;
            uVar5 = (long)puVar10 - (long)puVar12 >> 3;
            while (0 < (long)uVar5) {
              uVar8 = uVar5 >> 1;
              uVar9 = ~uVar8 + uVar5;
              uVar5 = uVar8;
              if ((puVar12 + uVar8 + 1)[-1] < uVar7) {
                puVar12 = puVar12 + uVar8 + 1;
                uVar5 = uVar9;
              }
            }
          }
          if ((puVar12 == puVar10) || (uVar15 == uVar1)) break;
        }
      }
      lVar6 = uVar16 + uVar3;
      uVar3 = local_80;
      if (local_80 <= lVar6 - uVar1) {
        return -INFINITY;
      }
    }
    if ((1 < uVar3) && ((__z != 0.0 || (NAN(__z))))) {
      if ((__z != dVar18 * dVar18) || (NAN(__z) || NAN(dVar18 * dVar18))) {
        auVar17._8_4_ = (int)(uVar3 >> 0x20);
        auVar17._0_8_ = uVar3;
        auVar17._12_4_ = 0x45300000;
        dVar21 = (auVar17._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
        dVar23 = dVar18 / dVar21;
        dVar20 = dVar23 * dVar23;
        dVar22 = __z / dVar21 - dVar20;
        if ((!NAN(dVar22)) &&
           ((2.220446049250313e-16 < dVar22 ||
            (bVar2 = check_more_than_two_unique_values<double,unsigned_long>
                               (ix_arr,st,end,col_num,Xc_indptr,Xc_ind,Xc,missing_action), bVar2))))
        {
          if (dVar22 <= 0.0) {
            return 0.0;
          }
          dVar19 = (dVar20 * dVar23 * dVar23 * dVar21 +
                   dVar18 * -4.0 * dVar20 * dVar23 +
                   __z * 6.0 * dVar20 + local_d0 * -4.0 * dVar23 + dVar19) /
                   (dVar22 * dVar22 * dVar21);
          if ((long)ABS(dVar19) < 0x7ff0000000000000) {
            if (dVar19 <= 0.0) {
              return 0.0;
            }
            return dVar19;
          }
          return -INFINITY;
        }
      }
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                     real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                     MissingAction missing_action)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    size_t cnt = end - st + 1;

    if (unlikely(cnt <= 1)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                xval = Xc[curr_pos];
                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt--;
                }

                else
                {
                    /* TODO: is it safe to use FMA here? some calculations rely on assuming that
                       some of these 's' are larger than the others. Would this procedure be guaranteed
                       to preserve such differences if done with a mixture of sums and FMAs? */
                    x_sq = square(xval);
                    s1 += xval;
                    s2  = std::fma(xval, xval, s2);
                    s3  = std::fma(x_sq, xval, s3);
                    s4  = std::fma(x_sq, x_sq, s4);
                    // s1 += pw1(xval);
                    // s2 += pw2(xval);
                    // s3 += pw3(xval);
                    // s4 += pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= (end - st + 1) - (Xc_indptr[col_num+1] - Xc_indptr[col_num]))) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                xval = Xc[curr_pos];
                x_sq = square(xval);
                s1 += xval;
                s2  = std::fma(xval, xval, s2);
                s3  = std::fma(x_sq, xval, s3);
                s4  = std::fma(x_sq, x_sq, s4);
                // s1 += pw1(xval);
                // s2 += pw2(xval);
                // s3 += pw3(xval);
                // s4 += pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe cnt_l = (ldouble_safe) cnt;
    ldouble_safe sn = s1 / cnt_l;
    ldouble_safe v  = s2 / cnt_l - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (unlikely(v <= 0)) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt_l * pw4(sn)) / (cnt_l * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}